

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O1

int libtorrent::aux::count_leading_zeros_sw(span<const_unsigned_int> buf)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = (uint)buf.m_len;
  bVar7 = 0 < (int)uVar2;
  if (0 < (int)uVar2) {
    uVar5 = *buf.m_ptr;
    in_ECX = 0x1f;
    if (uVar5 == 0) {
      uVar4 = (ulong)(uVar2 & 0x7fffffff);
      uVar1 = 1;
      do {
        uVar6 = uVar1;
        if (uVar4 == uVar6) {
          bVar7 = uVar6 < uVar4;
          goto LAB_001b8215;
        }
        uVar5 = buf.m_ptr[uVar6];
        in_ECX = in_ECX + 0x20;
        uVar1 = uVar6 + 1;
      } while (uVar5 == 0);
      bVar7 = uVar6 < uVar4;
    }
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = uVar5 >> 1 | uVar5;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    in_ECX = in_ECX - log2p1::MultiplyDeBruijnBitPosition
                      [(uVar5 >> 0x10 | uVar5) * 0x7c4acdd >> 0x1b];
  }
LAB_001b8215:
  iVar3 = uVar2 << 5;
  if (bVar7) {
    iVar3 = in_ECX;
  }
  return iVar3;
}

Assistant:

int count_leading_zeros_sw(span<std::uint32_t const> buf)
	{
		auto const num = int(buf.size());
		std::uint32_t const* ptr = buf.data();

		TORRENT_ASSERT(num >= 0);
		TORRENT_ASSERT(ptr != nullptr);

		for (int i = 0; i < num; i++)
		{
			if (ptr[i] == 0) continue;
			return i * 32 + 31 - log2p1(aux::network_to_host(ptr[i]));
		}

		return num * 32;
	}